

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-lexer.cc
# Opt level: O1

Token * __thiscall wabt::WastLexer::GetToken(Token *__return_storage_ptr__,WastLexer *this)

{
  byte *pbVar1;
  byte *pbVar2;
  char *pcVar3;
  long lVar4;
  size_t sVar5;
  byte *pbVar6;
  byte *pbVar7;
  uint uVar8;
  TokenType TVar9;
  anon_class_8_1_8991fb9c column;
  bool bVar10;
  string_view name;
  Token local_70;
  
LAB_0018d6d4:
  pbVar1 = (byte *)this->buffer_end_;
  pbVar2 = (byte *)this->cursor_;
  this->token_start_ = (char *)pbVar2;
  uVar8 = 0xffffffff;
  if (pbVar2 < pbVar1) {
    uVar8 = (uint)*pbVar2;
  }
  if (0x60 < (int)uVar8) {
    if ((int)uVar8 < 0x6e) {
      if (uVar8 == 0x61) {
        pcVar3 = "align=";
        sVar5 = 6;
        TVar9 = AlignEqNat;
LAB_0018da28:
        name._M_str = pcVar3;
        name._M_len = sVar5;
        GetNameEqNumToken(__return_storage_ptr__,this,name,TVar9);
        return __return_storage_ptr__;
      }
      if (uVar8 == 0x69) goto LAB_0018db20;
    }
    else {
      if (uVar8 == 0x6e) goto LAB_0018db0b;
      if (uVar8 == 0x6f) {
        pcVar3 = "offset=";
        sVar5 = 7;
        TVar9 = OffsetEqNat;
        goto LAB_0018da28;
      }
    }
    goto switchD_0018d709_caseD_b;
  }
  switch(uVar8) {
  case 9:
  case 10:
  case 0xd:
  case 0x20:
    ReadWhitespace(this);
    goto LAB_0018d6d4;
  case 0x22:
    GetStringToken(__return_storage_ptr__,this);
    return __return_storage_ptr__;
  case 0x24:
    GetIdChars(__return_storage_ptr__,this);
    return __return_storage_ptr__;
  case 0x28:
    goto switchD_0018d709_caseD_28;
  case 0x29:
    if (pbVar2 < pbVar1) {
      this->cursor_ = (char *)(pbVar2 + 1);
    }
    TVar9 = Rpar;
    goto LAB_0018dbbe;
  case 0x2b:
  case 0x2d:
    if (pbVar2 < pbVar1) {
      this->cursor_ = (char *)(pbVar2 + 1);
    }
    pbVar2 = (byte *)this->cursor_;
    uVar8 = 0xffffffff;
    if (pbVar2 < pbVar1) {
      uVar8 = (uint)*pbVar2;
    }
    if (uVar8 - 0x31 < 9) goto LAB_0018d930;
    if (uVar8 == 0x6e) {
LAB_0018db0b:
      GetNanToken(__return_storage_ptr__,this);
      return __return_storage_ptr__;
    }
    if (uVar8 == 0x69) {
LAB_0018db20:
      GetInfToken(__return_storage_ptr__,this);
      return __return_storage_ptr__;
    }
    if (uVar8 != 0x30) {
      GetReservedToken(__return_storage_ptr__,this);
      return __return_storage_ptr__;
    }
    bVar10 = false;
    lVar4 = 0;
    pbVar6 = pbVar2;
    goto LAB_0018dad2;
  case 0x30:
    bVar10 = false;
    lVar4 = 0;
    pbVar6 = pbVar2;
    break;
  case 0x31:
  case 0x32:
  case 0x33:
  case 0x34:
  case 0x35:
  case 0x36:
  case 0x37:
  case 0x38:
  case 0x39:
    goto switchD_0018d709_caseD_31;
  case 0x3b:
    bVar10 = false;
    lVar4 = 0;
    pbVar6 = pbVar2;
    do {
      uVar8 = 0xffffffff;
      pbVar7 = pbVar6;
      if (pbVar6 < pbVar1) {
        pbVar7 = pbVar6 + 1;
        this->cursor_ = (char *)pbVar7;
        uVar8 = (uint)*pbVar6;
      }
      if (uVar8 != (int)";;"[lVar4]) {
        this->cursor_ = (char *)pbVar2;
        break;
      }
      lVar4 = lVar4 + 1;
      bVar10 = lVar4 == 2;
      pbVar6 = pbVar7;
    } while (!bVar10);
    if (bVar10) {
      bVar10 = ReadLineComment(this);
      goto LAB_0018d7cf;
    }
    if (this->cursor_ < pbVar1) {
      this->cursor_ = this->cursor_ + 1;
    }
    goto LAB_0018d8e8;
  default:
    if (uVar8 == 0xffffffff) goto LAB_0018d945;
  case 0xb:
  case 0xc:
  case 0xe:
  case 0xf:
  case 0x10:
  case 0x11:
  case 0x12:
  case 0x13:
  case 0x14:
  case 0x15:
  case 0x16:
  case 0x17:
  case 0x18:
  case 0x19:
  case 0x1a:
  case 0x1b:
  case 0x1c:
  case 0x1d:
  case 0x1e:
  case 0x1f:
  case 0x21:
  case 0x23:
  case 0x25:
  case 0x26:
  case 0x27:
  case 0x2a:
  case 0x2c:
  case 0x2e:
  case 0x2f:
  case 0x3a:
switchD_0018d709_caseD_b:
    if (pbVar2 < pbVar1) {
      lVar4 = (ulong)*pbVar2 + 1;
    }
    else {
      lVar4 = 0;
    }
    if ((""[lVar4] & 2U) != 0) {
      GetKeywordToken(__return_storage_ptr__,this);
      return __return_storage_ptr__;
    }
    if (pbVar2 < pbVar1) {
      lVar4 = (ulong)*pbVar2 + 1;
    }
    else {
      lVar4 = 0;
    }
    if ((""[lVar4] & 1U) != 0) {
      ReadReservedChars(this);
      TVar9 = Reserved;
      sVar5 = 0;
      goto LAB_0018db97;
    }
    if (pbVar2 < pbVar1) {
      this->cursor_ = (char *)(pbVar2 + 1);
    }
LAB_0018d8e8:
    Error(this,0x1fe14b);
    goto LAB_0018d6d4;
  }
  while( true ) {
    lVar4 = lVar4 + 1;
    bVar10 = lVar4 == 2;
    pbVar6 = pbVar7;
    if (bVar10) break;
    uVar8 = 0xffffffff;
    pbVar7 = pbVar6;
    if (pbVar6 < pbVar1) {
      pbVar7 = pbVar6 + 1;
      this->cursor_ = (char *)pbVar7;
      uVar8 = (uint)*pbVar6;
    }
    if (uVar8 != (int)", 0x"[lVar4 + 2]) {
      this->cursor_ = (char *)pbVar2;
      break;
    }
  }
  if (bVar10) {
    TVar9 = Last_Literal;
    goto LAB_0018db4e;
  }
switchD_0018d709_caseD_31:
  TVar9 = Last_Literal;
  goto LAB_0018db65;
switchD_0018d709_caseD_28:
  bVar10 = false;
  lVar4 = 0;
  pbVar6 = pbVar2;
  do {
    uVar8 = 0xffffffff;
    pbVar7 = pbVar6;
    if (pbVar6 < pbVar1) {
      pbVar7 = pbVar6 + 1;
      this->cursor_ = (char *)pbVar7;
      uVar8 = (uint)*pbVar6;
    }
    if (uVar8 != (int)"(;"[lVar4]) {
      this->cursor_ = (char *)pbVar2;
      break;
    }
    lVar4 = lVar4 + 1;
    bVar10 = lVar4 == 2;
    pbVar6 = pbVar7;
  } while (!bVar10);
  if (!bVar10) {
    pbVar2 = (byte *)this->cursor_;
    bVar10 = false;
    lVar4 = 0;
    pbVar6 = pbVar2;
    goto LAB_0018da59;
  }
  bVar10 = ReadBlockComment(this);
LAB_0018d7cf:
  if (bVar10 == false) goto LAB_0018d945;
  goto LAB_0018d6d4;
LAB_0018d945:
  TVar9 = Eof;
  goto LAB_0018dbbe;
  while( true ) {
    lVar4 = lVar4 + 1;
    bVar10 = lVar4 == 2;
    pbVar6 = pbVar7;
    if (bVar10) break;
LAB_0018dad2:
    uVar8 = 0xffffffff;
    pbVar7 = pbVar6;
    if (pbVar6 < pbVar1) {
      pbVar7 = pbVar6 + 1;
      this->cursor_ = (char *)pbVar7;
      uVar8 = (uint)*pbVar6;
    }
    if (uVar8 != (int)", 0x"[lVar4 + 2]) {
      this->cursor_ = (char *)pbVar2;
      break;
    }
  }
  if (bVar10) {
    TVar9 = Int;
LAB_0018db4e:
    GetHexNumberToken(__return_storage_ptr__,this,TVar9);
    return __return_storage_ptr__;
  }
LAB_0018d930:
  TVar9 = Int;
LAB_0018db65:
  GetNumberToken(__return_storage_ptr__,this,TVar9);
  return __return_storage_ptr__;
  while( true ) {
    lVar4 = lVar4 + 1;
    bVar10 = lVar4 == 2;
    pbVar6 = pbVar7;
    if (bVar10) break;
LAB_0018da59:
    uVar8 = 0xffffffff;
    pbVar7 = pbVar6;
    if (pbVar6 < pbVar1) {
      pbVar7 = pbVar6 + 1;
      this->cursor_ = (char *)pbVar7;
      uVar8 = (uint)*pbVar6;
    }
    if (uVar8 != (int)"(@"[lVar4]) {
      this->cursor_ = (char *)pbVar2;
      break;
    }
  }
  if (bVar10) {
    GetIdChars(&local_70,this);
    sVar5 = 2;
    TVar9 = LparAnn;
LAB_0018db97:
    TextToken(__return_storage_ptr__,this,TVar9,sVar5);
    return __return_storage_ptr__;
  }
  if (this->cursor_ < pbVar1) {
    this->cursor_ = this->cursor_ + 1;
  }
  TVar9 = Lpar;
LAB_0018dbbe:
  BareToken(__return_storage_ptr__,this,TVar9);
  return __return_storage_ptr__;
}

Assistant:

Token WastLexer::GetToken() {
  while (true) {
    token_start_ = cursor_;
    switch (PeekChar()) {
      case kEof:
        return BareToken(TokenType::Eof);

      case '(':
        if (MatchString("(;")) {
          if (ReadBlockComment()) {
            continue;
          }
          return BareToken(TokenType::Eof);
        } else if (MatchString("(@")) {
          GetIdChars();
          // offset=2 to skip the "(@" prefix
          return TextToken(TokenType::LparAnn, 2);
        } else {
          ReadChar();
          return BareToken(TokenType::Lpar);
        }
        break;

      case ')':
        ReadChar();
        return BareToken(TokenType::Rpar);

      case ';':
        if (MatchString(";;")) {
          if (ReadLineComment()) {
            continue;
          }
          return BareToken(TokenType::Eof);
        } else {
          ReadChar();
          ERROR("unexpected char");
          continue;
        }
        break;

      case ' ':
      case '\t':
      case '\r':
      case '\n':
        ReadWhitespace();
        continue;

      case '"':
        return GetStringToken();

      case '+':
      case '-':
        ReadChar();
        switch (PeekChar()) {
          case 'i':
            return GetInfToken();

          case 'n':
            return GetNanToken();

          case '0':
            return MatchString("0x") ? GetHexNumberToken(TokenType::Int)
                                     : GetNumberToken(TokenType::Int);
          case '1':
          case '2':
          case '3':
          case '4':
          case '5':
          case '6':
          case '7':
          case '8':
          case '9':
            return GetNumberToken(TokenType::Int);

          default:
            return GetReservedToken();
        }
        break;

      case '0':
        return MatchString("0x") ? GetHexNumberToken(TokenType::Nat)
                                 : GetNumberToken(TokenType::Nat);

      case '1':
      case '2':
      case '3':
      case '4':
      case '5':
      case '6':
      case '7':
      case '8':
      case '9':
        return GetNumberToken(TokenType::Nat);

      case '$':
        return GetIdChars();  // Initial $ is idchar, so this produces id token

      case 'a':
        return GetNameEqNumToken("align=", TokenType::AlignEqNat);

      case 'i':
        return GetInfToken();

      case 'n':
        return GetNanToken();

      case 'o':
        return GetNameEqNumToken("offset=", TokenType::OffsetEqNat);

      default:
        if (IsKeyword(PeekChar())) {
          return GetKeywordToken();
        } else if (IsIdChar(PeekChar())) {
          return GetReservedToken();
        } else {
          ReadChar();
          ERROR("unexpected char");
          continue;
        }
    }
  }
}